

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O3

Constraint *
create_not_equal_to_contents_constraint
          (void *pointer_to_compare,size_t size_to_compare,char *compared_pointer_name)

{
  Constraint *pCVar1;
  char *pcVar2;
  CgreenValue local_38;
  
  make_cgreen_pointer_value(&local_38,pointer_to_compare);
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[%ld]";
  (pCVar1->expected_value).type = local_38.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_38._4_4_;
  (pCVar1->expected_value).value = local_38.value;
  (pCVar1->expected_value).value_size = local_38.value_size;
  pcVar2 = string_dup(compared_pointer_name);
  pCVar1->expected_value_name = pcVar2;
  pCVar1->type = CGREEN_CONTENT_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_do_not_want_contents;
  pCVar1->execute = test_want;
  pCVar1->name = "not equal contents of";
  pCVar1->size_of_expected_value = size_to_compare;
  return pCVar1;
}

Assistant:

Constraint *create_not_equal_to_contents_constraint(void *pointer_to_compare, size_t size_to_compare, const char *compared_pointer_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_pointer_value(pointer_to_compare), compared_pointer_name);
    constraint->type = CGREEN_CONTENT_COMPARER_CONSTRAINT;

    constraint->compare = &compare_do_not_want_contents;
    constraint->execute = &test_want;
    constraint->name = "not equal contents of";
    constraint->size_of_expected_value = size_to_compare;

    return constraint;
}